

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O0

void __thiscall
Imath_3_2::Box<Imath_3_2::Vec2<float>_>::extendBy
          (Box<Imath_3_2::Vec2<float>_> *this,Vec2<float> *point)

{
  float *pfVar1;
  float *in_RSI;
  float *in_RDI;
  
  pfVar1 = std::min<float>(in_RDI,in_RSI);
  *in_RDI = *pfVar1;
  pfVar1 = std::max<float>(in_RDI + 2,in_RSI);
  in_RDI[2] = *pfVar1;
  pfVar1 = std::min<float>(in_RDI + 1,in_RSI + 1);
  in_RDI[1] = *pfVar1;
  pfVar1 = std::max<float>(in_RDI + 3,in_RSI + 1);
  in_RDI[3] = *pfVar1;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Box<Vec2<T>>::extendBy (const Vec2<T>& point) IMATH_NOEXCEPT
{
    min.x = std::min (min.x, point.x);
    max.x = std::max (max.x, point.x);
    min.y = std::min (min.y, point.y);
    max.y = std::max (max.y, point.y);
}